

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

void __thiscall QHostInfoCache::clear(QHostInfoCache *this)

{
  long lVar1;
  QCache<QString,_QHostInfoCache::QHostInfoCacheElement> *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)in_RDI,in_stack_ffffffffffffffc8);
  QCache<QString,_QHostInfoCache::QHostInfoCacheElement>::clear(in_RDI);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHostInfoCache::clear()
{
    QMutexLocker locker(&this->mutex);
    cache.clear();
}